

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

BuiltinFunction Js::JavascriptLibrary::GetBuiltinFunctionForPropId(PropertyId id)

{
  byte bVar1;
  
  switch(id) {
  case 0x17:
    bVar1 = 'A';
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x22:
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x41:
    goto switchD_00a9f678_caseD_14f;
  case 0x1d:
    bVar1 = '\0';
    break;
  case 0x1e:
    bVar1 = '\x01';
    break;
  case 0x20:
    bVar1 = '\x02';
    break;
  case 0x21:
    bVar1 = '\x03';
    break;
  case 0x23:
    bVar1 = '\x05';
    break;
  case 0x24:
    bVar1 = ' ';
    break;
  case 0x25:
    bVar1 = '!';
    break;
  case 0x26:
    bVar1 = '\"';
    break;
  case 0x27:
    bVar1 = '#';
    break;
  case 0x2a:
    bVar1 = '%';
    break;
  case 0x2c:
    bVar1 = '&';
    break;
  case 0x2d:
    bVar1 = '+';
    break;
  case 0x2e:
    bVar1 = ',';
    break;
  case 0x2f:
    bVar1 = '-';
    break;
  case 0x30:
    bVar1 = '.';
    break;
  case 0x31:
    bVar1 = '/';
    break;
  case 0x40:
    bVar1 = '\'';
    break;
  case 0x42:
    bVar1 = 'B';
    break;
  default:
    switch(id) {
    case 0x171:
      bVar1 = '\x17';
      break;
    case 0x172:
    case 0x173:
    case 0x176:
    case 0x177:
    case 0x178:
    case 0x179:
    case 0x17a:
    case 0x17c:
    case 0x184:
    case 0x185:
    case 0x186:
    case 0x187:
    case 0x188:
    case 0x189:
      goto switchD_00a9f678_caseD_14f;
    case 0x174:
      bVar1 = '\x18';
      break;
    case 0x175:
      bVar1 = '\x19';
      break;
    case 0x17b:
      bVar1 = '\x1a';
      break;
    case 0x17d:
      bVar1 = '\x1b';
      break;
    case 0x17e:
      bVar1 = '\x1c';
      break;
    case 0x17f:
      bVar1 = '\x1d';
      break;
    case 0x180:
      bVar1 = '\x1e';
      break;
    case 0x181:
      bVar1 = '\x1f';
      break;
    case 0x182:
      bVar1 = 'C';
      break;
    case 0x183:
      bVar1 = 'D';
      break;
    case 0x18a:
      bVar1 = ';';
      break;
    default:
      switch(id) {
      case 0xb6:
        bVar1 = 'F';
        break;
      case 0xb7:
        bVar1 = 'E';
        break;
      case 0xb8:
        bVar1 = '3';
        break;
      case 0xb9:
        bVar1 = '2';
        break;
      case 0xba:
      case 0xbb:
      case 0xbc:
      case 0xbd:
        goto switchD_00a9f678_caseD_14f;
      case 0xbe:
        bVar1 = '4';
        break;
      default:
        switch(id) {
        case 0x5f:
          bVar1 = '\b';
          break;
        case 0x60:
          bVar1 = '\t';
          break;
        case 0x61:
          bVar1 = '\a';
          break;
        case 0x62:
        case 99:
        case 100:
          goto switchD_00a9f678_caseD_14f;
        case 0x65:
          bVar1 = '1';
          break;
        default:
          switch(id) {
          case 0x14e:
            bVar1 = '8';
            break;
          case 0x150:
            bVar1 = '9';
            break;
          case 0x155:
            bVar1 = ':';
            break;
          case 0x156:
            bVar1 = '\x14';
            break;
          default:
            if (id == 0x4e) {
              return (BuiltinFunction)'<';
            }
            if (id == 0x51) {
              return (BuiltinFunction)'0';
            }
            if (id == 0x83) {
              return (BuiltinFunction)'@';
            }
            if (id == 0x96) {
              return (BuiltinFunction)'\v';
            }
            if (id == 0x97) {
              return (BuiltinFunction)'\f';
            }
            if (id == 0xcc) {
              return (BuiltinFunction)'5';
            }
            if (id == 0xd0) {
              return (BuiltinFunction)'6';
            }
            if (id == 0xd2) {
              return (BuiltinFunction)'\x0f';
            }
            if (id == 0xfe) {
              return (BuiltinFunction)'$';
            }
            if (id == 0x101) {
              return (BuiltinFunction)'\x10';
            }
            if (id == 0x127) {
              return (BuiltinFunction)')';
            }
            if (id == 0x133) {
              return (BuiltinFunction)'\x11';
            }
            if (id == 0x136) {
              return (BuiltinFunction)'7';
            }
            if (id == 0x13c) {
              return (BuiltinFunction)'\x12';
            }
            if (id == 0x15e) {
              return (BuiltinFunction)'\x16';
            }
            if (id == 0x15f) {
              return (BuiltinFunction)'\x15';
            }
          case 0x14f:
          case 0x151:
          case 0x152:
          case 0x153:
          case 0x154:
switchD_00a9f678_caseD_14f:
            bVar1 = 'H';
          }
        }
      }
    }
  }
  return (BuiltinFunction)bVar1;
}

Assistant:

BuiltinFunction JavascriptLibrary::GetBuiltinFunctionForPropId(PropertyId id)
    {
        switch (id)
        {
        case PropertyIds::abs:
            return BuiltinFunction::Math_Abs;

        // For now, avoid mapping Math.atan2 to a direct CRT call, as the
        // fast CRT helper doesn't handle denormals correctly.
        // case PropertyIds::atan2:
        //    return BuiltinFunction::Atan2;

        case PropertyIds::acos:
            return BuiltinFunction::Math_Acos;

        case PropertyIds::asin:
            return BuiltinFunction::Math_Asin;

        case PropertyIds::atan:
            return BuiltinFunction::Math_Atan;

        case PropertyIds::cos:
            return BuiltinFunction::Math_Cos;

        case PropertyIds::exp:
            return BuiltinFunction::Math_Exp;

        case PropertyIds::log:
            return BuiltinFunction::Math_Log;

        case PropertyIds::pow:
            return BuiltinFunction::Math_Pow;

        case PropertyIds::random:
            return BuiltinFunction::Math_Random;

        case PropertyIds::sin:
            return BuiltinFunction::Math_Sin;

        case PropertyIds::sqrt:
            return BuiltinFunction::Math_Sqrt;

        case PropertyIds::tan:
            return BuiltinFunction::Math_Tan;

        case PropertyIds::floor:
            return BuiltinFunction::Math_Floor;

        case PropertyIds::ceil:
            return BuiltinFunction::Math_Ceil;

        case PropertyIds::round:
            return BuiltinFunction::Math_Round;

         case PropertyIds::max:
            return BuiltinFunction::Math_Max;

        case PropertyIds::min:
            return BuiltinFunction::Math_Min;

        case PropertyIds::imul:
            return BuiltinFunction::Math_Imul;

        case PropertyIds::fround:
            return BuiltinFunction::Math_Fround;

        case PropertyIds::codePointAt:
            return BuiltinFunction::JavascriptString_CodePointAt;

        case PropertyIds::at:
            return BuiltinFunction::JavascriptArray_At;

        case PropertyIds::push:
            return BuiltinFunction::JavascriptArray_Push;

        case PropertyIds::concat:
            return BuiltinFunction::JavascriptArray_Concat;

        case PropertyIds::indexOf:
            return BuiltinFunction::JavascriptArray_IndexOf;

        case PropertyIds::includes:
            return BuiltinFunction::JavascriptArray_Includes;

        case PropertyIds::isArray:
            return BuiltinFunction::JavascriptArray_IsArray;

        case PropertyIds::join:
            return BuiltinFunction::JavascriptArray_Join;

        case PropertyIds::lastIndexOf:
            return BuiltinFunction::JavascriptArray_LastIndexOf;

        case PropertyIds::reverse:
            return BuiltinFunction::JavascriptArray_Reverse;

        case PropertyIds::shift:
            return BuiltinFunction::JavascriptArray_Shift;

        case PropertyIds::slice:
            return BuiltinFunction::JavascriptArray_Slice;

        case PropertyIds::splice:
            return BuiltinFunction::JavascriptArray_Splice;

        case PropertyIds::unshift:
            return BuiltinFunction::JavascriptArray_Unshift;

        case PropertyIds::apply:
            return BuiltinFunction::JavascriptFunction_Apply;

        case PropertyIds::charAt:
            return BuiltinFunction::JavascriptString_CharAt;

        case PropertyIds::charCodeAt:
            return BuiltinFunction::JavascriptString_CharCodeAt;

        case PropertyIds::fromCharCode:
            return BuiltinFunction::JavascriptString_FromCharCode;

        case PropertyIds::fromCodePoint:
                return BuiltinFunction::JavascriptString_FromCodePoint;

        case PropertyIds::link:
            return BuiltinFunction::JavascriptString_Link;

        case PropertyIds::match:
            return BuiltinFunction::JavascriptString_Match;

        case PropertyIds::replace:
            return BuiltinFunction::JavascriptString_Replace;

        case PropertyIds::search:
            return BuiltinFunction::JavascriptString_Search;

        case PropertyIds::_symbolSearch:
            return BuiltinFunction::JavascriptRegExp_SymbolSearch;

        case PropertyIds::split:
            return BuiltinFunction::JavascriptString_Split;

        case PropertyIds::substr:
            return BuiltinFunction::JavascriptString_Substr;

        case PropertyIds::substring:
            return BuiltinFunction::JavascriptString_Substring;

        case PropertyIds::toLocaleLowerCase:
            return BuiltinFunction::JavascriptString_ToLocaleLowerCase;

        case PropertyIds::toLocaleUpperCase:
            return BuiltinFunction::JavascriptString_ToLocaleUpperCase;

        case PropertyIds::toLowerCase:
            return BuiltinFunction::JavascriptString_ToLowerCase;

        case PropertyIds::toUpperCase:
            return BuiltinFunction::JavascriptString_ToUpperCase;

        case PropertyIds::trim:
            return BuiltinFunction::JavascriptString_Trim;

        case PropertyIds::trimLeft:
            return BuiltinFunction::JavascriptString_TrimLeft;

        case PropertyIds::trimStart:
            return BuiltinFunction::JavascriptString_TrimStart;

        case PropertyIds::trimRight:
            return BuiltinFunction::JavascriptString_TrimRight;

        case PropertyIds::trimEnd:
            return BuiltinFunction::JavascriptString_TrimEnd;

        case PropertyIds::padStart:
            return BuiltinFunction::JavascriptString_PadStart;

        case PropertyIds::padEnd:
            return BuiltinFunction::JavascriptString_PadEnd;

        case PropertyIds::exec:
            return BuiltinFunction::JavascriptRegExp_Exec;

        case PropertyIds::hasOwnProperty:
            return BuiltinFunction::JavascriptObject_HasOwnProperty;

        case PropertyIds::hasOwn:
            return BuiltinFunction::JavascriptObject_HasOwn;

        default:
            return BuiltinFunction::None;
        }
    }